

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CloneInstsToBlock
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *block,
          Instruction *inst_to_skip_cloning,
          deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *insts_to_be_cloned,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *old_ids_to_new_ids)

{
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  this_00;
  uint32_t uVar1;
  bool bVar2;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *p_Var3;
  IRContext *pIVar4;
  Instruction *__p;
  mapped_type *pmVar5;
  DefUseManager *this_01;
  pointer pIVar6;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_98;
  uint32_t local_90;
  uint32_t local_8c;
  uint32_t new_id;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> clone;
  Instruction *inst_to_be_cloned;
  const_iterator __end2;
  const_iterator __begin2;
  deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *old_ids_to_new_ids_local;
  deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *insts_to_be_cloned_local;
  Instruction *inst_to_skip_cloning_local;
  BasicBlock *block_local;
  ReplaceDescArrayAccessUsingVarIndex *this_local;
  
  std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::begin
            ((const_iterator *)&__end2._M_node,insts_to_be_cloned);
  std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::end
            ((const_iterator *)&inst_to_be_cloned,insts_to_be_cloned);
  while (bVar2 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&inst_to_be_cloned), bVar2) {
    p_Var3 = (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)std::
                _Deque_iterator<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*const_&,_spvtools::opt::Instruction_*const_*>
                ::operator*((_Deque_iterator<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*const_&,_spvtools::opt::Instruction_*const_*>
                             *)&__end2._M_node);
    this_00._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = p_Var3->_M_t;
    clone._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this_00;
    if (this_00._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
        (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
        inst_to_skip_cloning) {
      pIVar4 = Pass::context(&this->super_Pass);
      __p = opt::Instruction::Clone
                      ((Instruction *)
                       this_00._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
                       pIVar4);
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&stack0xffffffffffffff78,__p);
      bVar2 = opt::Instruction::HasResultId
                        ((Instruction *)
                         clone._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
      if (bVar2) {
        pIVar4 = Pass::context(&this->super_Pass);
        local_8c = IRContext::TakeNextId(pIVar4);
        pIVar6 = std::
                 unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ::operator->((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               *)&stack0xffffffffffffff78);
        opt::Instruction::SetResultId(pIVar6,local_8c);
        uVar1 = local_8c;
        local_90 = opt::Instruction::result_id
                             ((Instruction *)
                              clone._M_t.
                              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                              _M_head_impl);
        pmVar5 = std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](old_ids_to_new_ids,&local_90);
        *pmVar5 = uVar1;
      }
      this_01 = Pass::get_def_use_mgr(&this->super_Pass);
      pIVar6 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::get((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)&stack0xffffffffffffff78);
      analysis::DefUseManager::AnalyzeInstDefUse(this_01,pIVar6);
      pIVar4 = Pass::context(&this->super_Pass);
      pIVar6 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::get((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)&stack0xffffffffffffff78);
      IRContext::set_instr_block(pIVar4,pIVar6,block);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::unique_ptr(&local_98,
                   (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    *)&stack0xffffffffffffff78);
      BasicBlock::AddInstruction(block,&local_98);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_98);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)&stack0xffffffffffffff78);
    }
    std::
    _Deque_iterator<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*const_&,_spvtools::opt::Instruction_*const_*>
    ::operator++((_Deque_iterator<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*const_&,_spvtools::opt::Instruction_*const_*>
                  *)&__end2._M_node);
  }
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::CloneInstsToBlock(
    BasicBlock* block, Instruction* inst_to_skip_cloning,
    const std::deque<Instruction*>& insts_to_be_cloned,
    std::unordered_map<uint32_t, uint32_t>* old_ids_to_new_ids) const {
  for (auto* inst_to_be_cloned : insts_to_be_cloned) {
    if (inst_to_be_cloned == inst_to_skip_cloning) continue;
    std::unique_ptr<Instruction> clone(inst_to_be_cloned->Clone(context()));
    if (inst_to_be_cloned->HasResultId()) {
      uint32_t new_id = context()->TakeNextId();
      clone->SetResultId(new_id);
      (*old_ids_to_new_ids)[inst_to_be_cloned->result_id()] = new_id;
    }
    get_def_use_mgr()->AnalyzeInstDefUse(clone.get());
    context()->set_instr_block(clone.get(), block);
    block->AddInstruction(std::move(clone));
  }
}